

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_audio.cpp
# Opt level: O3

void __thiscall synth_state::run<short>(synth_state *this,short *audiobuffer,long nframes)

{
  float fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  
  iVar2 = this->num_channels;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      lVar5 = lVar4 + 1;
      if (nframes < 1) {
        lVar3 = (long)iVar2;
      }
      else {
        fVar1 = this->sample_rate;
        fVar7 = this->phase[lVar4];
        lVar6 = 0;
        do {
          fVar7 = sinf(fVar7);
          iVar2 = this->num_channels;
          lVar3 = (long)iVar2;
          audiobuffer[lVar4 + lVar6 * lVar3] = (short)(int)(fVar7 * 0.2 * 32767.0);
          fVar7 = this->phase[lVar4] + ((float)(int)lVar5 * 220.0 * 6.2831855) / fVar1;
          this->phase[lVar4] = fVar7;
          lVar6 = lVar6 + 1;
        } while (nframes != lVar6);
      }
      lVar4 = lVar5;
    } while (lVar5 < lVar3);
  }
  return;
}

Assistant:

void run(T* audiobuffer, long nframes)
    {
      for(int c=0;c < num_channels;++c) {
        float freq = get_frequency(c);
        float phase_inc = 2.0 * M_PI * freq / sample_rate;
        for(long n=0;n < nframes;++n) {
          audiobuffer[n*num_channels+c] = ConvertSample<T>(sin(phase[c]) * VOLUME);
          phase[c] += phase_inc;
        }
      }
    }